

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint _c;
  int iVar7;
  _func_int *p_Var8;
  size_t sVar9;
  void *pvVar10;
  Layer *pLVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int j;
  int iVar23;
  int iVar24;
  uint uVar25;
  undefined4 extraout_EAX;
  Mat *this_00;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  uint _h;
  void *pvVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  int i_1;
  int iVar34;
  void *pvVar35;
  void *pvVar36;
  Convolution *pCVar37;
  long lVar38;
  void *pvVar39;
  long lVar40;
  int i;
  long lVar41;
  long lVar42;
  ulong uVar43;
  float (*pafVar44) [2];
  long lVar45;
  float *pfVar46;
  long lVar47;
  ulong uVar48;
  void *pvVar49;
  ulong uVar50;
  int iVar51;
  long lVar52;
  float fVar53;
  int iVar55;
  undefined1 auVar54 [16];
  uint _w;
  uint uVar56;
  uint _h_00;
  uint uVar57;
  float fVar58;
  long local_620;
  Mat bottom_blob_tm;
  float w0 [4];
  long local_588;
  float d3_1 [2];
  Mat top_blob_tm;
  Mat top_blob_bordered;
  long local_498;
  long local_460;
  float d3 [4];
  float d2 [4];
  size_t local_408;
  int local_3ec;
  Mat bottom_blob_bordered;
  Mat bottom_blob_bordered_1;
  float t1 [4];
  float t0 [4];
  size_t local_278;
  int local_25c;
  float t3 [4];
  float t2 [4];
  float w3 [4];
  size_t local_1b8;
  int local_19c;
  float w2 [4];
  size_t local_178;
  int local_15c;
  float w1 [4];
  size_t local_138;
  int local_11c;
  float local_b8 [2];
  float o0 [2];
  float sum3 [16];
  Option opt_b;
  
  if (bottom_blob->dims == 3) {
    p_Var8 = this->_vptr_Convolution_x86[-3];
    if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x148 + (long)p_Var8) == 1)) {
      iVar23 = forward_int8_x86(this,bottom_blob,top_blob,opt);
      return iVar23;
    }
    pCVar37 = (Convolution *)((long)&this->_vptr_Convolution_x86 + (long)p_Var8);
    iVar23 = *(int *)(p_Var8 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data);
    if (((iVar23 < 2) && (iVar33 = pCVar37->dilation_h, pCVar37->dilation_h < 2)) ||
       (((pCVar37->stride_w < 2 && (pCVar37->stride_h < 2)) &&
        ((iVar32 = pCVar37->dilation_h, iVar33 = iVar32, iVar32 < 2 && iVar23 < 2 ||
         (iVar33 = iVar23, iVar23 == iVar32)))))) {
      sVar9 = bottom_blob->elemsize;
      iVar32 = pCVar37->kernel_w;
      iVar55 = pCVar37->kernel_h;
      bottom_blob_bordered.elemsize._0_4_ = 0;
      bottom_blob_bordered.elemsize._4_4_ = 0;
      bottom_blob_bordered.elempack = 0;
      bottom_blob_bordered.data = (void *)0x0;
      bottom_blob_bordered.refcount._0_4_ = 0;
      bottom_blob_bordered.refcount._4_4_ = 0;
      bottom_blob_bordered.allocator = (Allocator *)0x0;
      bottom_blob_bordered.dims = 0;
      bottom_blob_bordered.w = 0;
      bottom_blob_bordered.h = 0;
      bottom_blob_bordered.c = 0;
      bottom_blob_bordered.cstep = 0;
      Convolution::make_padding
                ((Convolution *)
                 ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
                 bottom_blob,&bottom_blob_bordered,opt);
      iVar24 = -100;
      if ((bottom_blob_bordered.data != (void *)0x0) &&
         ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
        p_Var8 = this->_vptr_Convolution_x86[-3];
        iVar23 = (~((iVar32 + -1) * iVar23) + bottom_blob_bordered.w) /
                 *(int *)(p_Var8 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data);
        iVar51 = iVar23 + 1;
        iVar33 = (~((iVar55 + -1) * iVar33) + bottom_blob_bordered.h) /
                 *(int *)(p_Var8 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data);
        iVar32 = iVar33 + 1;
        Mat::create(top_blob,iVar51,iVar32,*(int *)(&this->use_winograd3x3_int8 + (long)p_Var8),
                    sVar9,opt->blob_allocator);
        if (top_blob->data != (void *)0x0) {
          _c = top_blob->c;
          uVar50 = (ulong)(int)_c;
          if (top_blob->cstep * uVar50 != 0) {
            p_Var8 = this->_vptr_Convolution_x86[-3];
            pCVar37 = (Convolution *)((long)&this->_vptr_Convolution_x86 + (long)p_Var8);
            iVar55 = *(int *)(&this->field_0xbc + (long)p_Var8);
            iVar24 = *(int *)(p_Var8 + (long)&(this->weight_3x3_winograd23_data_int8).data);
            if ((((iVar55 == iVar24) && (iVar7 = pCVar37->dilation_w, iVar7 != 1)) &&
                (pCVar37->dilation_h == iVar7)) &&
               ((pCVar37->stride_w == 1 && (pCVar37->stride_h == 1)))) {
              if ((iVar51 < iVar7) || (iVar32 < iVar7)) {
                iVar24 = Convolution::forward(pCVar37,bottom_blob,top_blob,opt);
              }
              else {
                iVar24 = forwardDilation_x86(this,&bottom_blob_bordered,top_blob,opt);
              }
            }
            else {
              if ((((iVar24 == 3 && iVar55 == 3) &&
                   ((pCVar37->dilation_w == 1 && (pCVar37->dilation_h == 1)))) &&
                  (pCVar37->stride_w == 1)) && (pCVar37->stride_h == 1)) {
                if (((iVar33 < 7) || (iVar23 < 7)) || (this->use_winograd3x3 == false)) {
                  conv_im2col_sgemm_sse
                            (&bottom_blob_bordered,top_blob,&this->weight_sgemm_data,
                             &pCVar37->bias_data,3,3,1,1,opt);
                }
                else {
                  iVar23 = bottom_blob_bordered.c;
                  lVar38 = (long)bottom_blob_bordered.c;
                  uVar3 = top_blob->w;
                  uVar5 = top_blob->h;
                  bottom_blob_bordered_1.refcount =
                       (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,
                                       bottom_blob_bordered.refcount._0_4_);
                  bottom_blob_bordered_1.data = bottom_blob_bordered.data;
                  bottom_blob_bordered_1.elemsize =
                       CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                (undefined4)bottom_blob_bordered.elemsize);
                  bottom_blob_bordered_1.elempack = bottom_blob_bordered.elempack;
                  bottom_blob_bordered_1.allocator = bottom_blob_bordered.allocator;
                  bottom_blob_bordered_1.dims = bottom_blob_bordered.dims;
                  bottom_blob_bordered_1.w = bottom_blob_bordered.w;
                  bottom_blob_bordered_1.h = bottom_blob_bordered.h;
                  bottom_blob_bordered_1.c = bottom_blob_bordered.c;
                  bottom_blob_bordered_1.cstep = bottom_blob_bordered.cstep;
                  if (bottom_blob_bordered_1.refcount != (int *)0x0) {
                    LOCK();
                    *bottom_blob_bordered_1.refcount = *bottom_blob_bordered_1.refcount + 1;
                    UNLOCK();
                  }
                  iVar32 = uVar3 + 1;
                  iVar55 = uVar5 + 1;
                  _w = iVar32 - (iVar32 >> 0x1f) & 0xfffffffe;
                  _h_00 = iVar55 - (iVar55 >> 0x1f) & 0xfffffffe;
                  iVar33 = _w + 2;
                  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
                  opt_b.use_packing_layout = opt->use_packing_layout;
                  opt_b.use_shader_pack8 = opt->use_shader_pack8;
                  opt_b.use_bf16_storage = opt->use_bf16_storage;
                  opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
                  opt_b.lightmode = opt->lightmode;
                  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
                  opt_b.num_threads = opt->num_threads;
                  opt_b.workspace_allocator = opt->workspace_allocator;
                  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
                  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
                  opt_b.use_int8_inference = opt->use_int8_inference;
                  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
                  opt_b.use_fp16_packed = opt->use_fp16_packed;
                  opt_b.use_fp16_storage = opt->use_fp16_storage;
                  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
                  opt_b.use_int8_storage = opt->use_int8_storage;
                  opt_b.blob_allocator = opt->workspace_allocator;
                  copy_make_border(&bottom_blob_bordered,&bottom_blob_bordered_1,0,
                                   (_h_00 - bottom_blob_bordered.h) + 2,0,
                                   iVar33 - bottom_blob_bordered.w,0,0.0,&opt_b);
                  uVar56 = iVar32 / 2;
                  uVar57 = iVar55 / 2;
                  pvVar10 = (pCVar37->bias_data).data;
                  bottom_blob_tm.elemsize = 0;
                  bottom_blob_tm.elempack = 0;
                  bottom_blob_tm.data = (void *)0x0;
                  bottom_blob_tm.refcount._0_4_ = 0;
                  bottom_blob_tm.refcount._4_4_ = 0;
                  bottom_blob_tm.allocator = (Allocator *)0x0;
                  bottom_blob_tm.dims = 0;
                  bottom_blob_tm.w = 0;
                  bottom_blob_tm.h = 0;
                  bottom_blob_tm.c = 0;
                  bottom_blob_tm.cstep = 0;
                  _h = uVar57 * uVar56;
                  Mat::create(&bottom_blob_tm,0x10,_h,iVar23,4,opt->workspace_allocator);
                  this_00 = &this->weight_3x3_winograd23_data;
                  lVar52 = (long)iVar33;
                  uVar31 = 0;
                  uVar25 = 0;
                  if (0 < (int)uVar56) {
                    uVar25 = uVar56;
                  }
                  uVar48 = (ulong)uVar57;
                  if ((int)uVar57 < 1) {
                    uVar48 = uVar31;
                  }
                  uVar26 = 0;
                  if (0 < iVar23) {
                    uVar26 = (ulong)(uint)iVar23;
                  }
                  for (; uVar31 != uVar26; uVar31 = uVar31 + 1) {
                    pvVar35 = (void *)(bottom_blob_bordered_1.cstep * uVar31 *
                                       bottom_blob_bordered_1.elemsize +
                                      (long)bottom_blob_bordered_1.data);
                    top_blob_tm.refcount._0_4_ = 0;
                    top_blob_tm.refcount._4_4_ = 0;
                    top_blob_tm.elemsize = bottom_blob_bordered_1.elemsize;
                    top_blob_tm.elempack = bottom_blob_bordered_1.elempack;
                    top_blob_tm.dims = 2;
                    top_blob_tm.allocator = bottom_blob_bordered_1.allocator;
                    top_blob_tm.w = bottom_blob_bordered_1.w;
                    top_blob_tm.c = 1;
                    top_blob_tm.h = bottom_blob_bordered_1.h;
                    top_blob_tm.cstep = (long)(bottom_blob_bordered_1.h * bottom_blob_bordered_1.w);
                    top_blob_tm.data = pvVar35;
                    Mat::~Mat(&top_blob_tm);
                    pvVar49 = (void *)(bottom_blob_tm.cstep * uVar31 * bottom_blob_tm.elemsize +
                                      (long)bottom_blob_tm.data);
                    top_blob_tm.refcount._0_4_ = 0;
                    top_blob_tm.refcount._4_4_ = 0;
                    top_blob_tm.elemsize = bottom_blob_tm.elemsize;
                    top_blob_tm.elempack = bottom_blob_tm.elempack;
                    top_blob_tm.dims = 2;
                    top_blob_tm.allocator = bottom_blob_tm.allocator;
                    top_blob_tm.w = bottom_blob_tm.w;
                    top_blob_tm.c = 1;
                    top_blob_tm.h = bottom_blob_tm.h;
                    top_blob_tm.cstep = (long)(bottom_blob_tm.h * bottom_blob_tm.w);
                    top_blob_tm.data = pvVar49;
                    Mat::~Mat(&top_blob_tm);
                    for (uVar27 = 0; uVar27 != uVar48; uVar27 = uVar27 + 1) {
                      pvVar29 = (void *)((long)(iVar33 * 2 * (int)uVar27) * 4 + (long)pvVar35);
                      pvVar30 = (void *)((long)pvVar29 + lVar52 * 4);
                      pvVar36 = (void *)((long)pvVar30 + lVar52 * 4);
                      pvVar39 = (void *)((long)pvVar36 + lVar52 * 4);
                      for (uVar57 = 0; uVar57 != uVar25; uVar57 = uVar57 + 1) {
                        for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 4) {
                          *(undefined4 *)((long)&top_blob_tm.data + lVar42) =
                               *(undefined4 *)((long)pvVar29 + lVar42);
                          *(undefined4 *)((long)&top_blob_bordered.data + lVar42) =
                               *(undefined4 *)((long)pvVar30 + lVar42);
                          *(undefined4 *)((long)d2 + lVar42) =
                               *(undefined4 *)((long)pvVar36 + lVar42);
                          *(undefined4 *)((long)d3 + lVar42) =
                               *(undefined4 *)((long)pvVar39 + lVar42);
                        }
                        for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 4) {
                          fVar53 = *(float *)((long)d2 + lVar42);
                          *(float *)((long)w0 + lVar42) =
                               *(float *)((long)&top_blob_tm.data + lVar42) - fVar53;
                          fVar58 = *(float *)((long)&top_blob_bordered.data + lVar42);
                          *(float *)((long)w1 + lVar42) = fVar58 + fVar53;
                          *(float *)((long)w2 + lVar42) = fVar53 - fVar58;
                          *(float *)((long)w3 + lVar42) = *(float *)((long)d3 + lVar42) - fVar58;
                        }
                        t0[0] = w0[0];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t1[0] = w0[1];
                        t2[1] = w1[2];
                        t2[0] = w0[2];
                        t3[1] = w1[3];
                        t3[0] = w0[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                        for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 4) {
                          fVar53 = *(float *)((long)t2 + lVar42);
                          *(float *)((long)&top_blob_tm.data + lVar42) =
                               *(float *)((long)t0 + lVar42) - fVar53;
                          fVar58 = *(float *)((long)t1 + lVar42);
                          *(float *)((long)&top_blob_bordered.data + lVar42) = fVar58 + fVar53;
                          *(float *)((long)d2 + lVar42) = fVar53 - fVar58;
                          *(float *)((long)d3 + lVar42) = *(float *)((long)t3 + lVar42) - fVar58;
                        }
                        for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 4) {
                          *(undefined4 *)((long)pvVar49 + lVar42) =
                               *(undefined4 *)((long)&top_blob_tm.data + lVar42);
                          *(undefined4 *)((long)pvVar49 + lVar42 + 0x10) =
                               *(undefined4 *)((long)&top_blob_bordered.data + lVar42);
                          *(undefined4 *)((long)pvVar49 + lVar42 + 0x20) =
                               *(undefined4 *)((long)d2 + lVar42);
                          *(undefined4 *)((long)pvVar49 + lVar42 + 0x30) =
                               *(undefined4 *)((long)d3 + lVar42);
                        }
                        pvVar29 = (void *)((long)pvVar29 + 8);
                        pvVar30 = (void *)((long)pvVar30 + 8);
                        pvVar36 = (void *)((long)pvVar36 + 8);
                        pvVar39 = (void *)((long)pvVar39 + 8);
                        pvVar49 = (void *)((long)pvVar49 + 0x40);
                      }
                    }
                  }
                  top_blob_tm.elemsize = 0;
                  top_blob_tm.elempack = 0;
                  top_blob_tm.data = (void *)0x0;
                  top_blob_tm.refcount._0_4_ = 0;
                  top_blob_tm.refcount._4_4_ = 0;
                  top_blob_tm.allocator = (Allocator *)0x0;
                  top_blob_tm.dims = 0;
                  top_blob_tm.w = 0;
                  top_blob_tm.h = 0;
                  top_blob_tm.c = 0;
                  top_blob_tm.cstep = 0;
                  Mat::operator=(&bottom_blob_bordered_1,&top_blob_tm);
                  Mat::~Mat(&top_blob_tm);
                  top_blob_tm.elemsize = 0;
                  top_blob_tm.elempack = 0;
                  top_blob_tm.data = (void *)0x0;
                  top_blob_tm.refcount._0_4_ = 0;
                  top_blob_tm.refcount._4_4_ = 0;
                  top_blob_tm.allocator = (Allocator *)0x0;
                  top_blob_tm.dims = 0;
                  top_blob_tm.w = 0;
                  top_blob_tm.h = 0;
                  top_blob_tm.c = 0;
                  top_blob_tm.cstep = 0;
                  Mat::create(&top_blob_tm,0x10,_h,_c,4,opt->workspace_allocator);
                  uVar26 = uVar50 & 0xfffffffffffffffc;
                  uVar27 = 0;
                  uVar31 = (ulong)_h;
                  if ((int)_h < 1) {
                    uVar31 = uVar27;
                  }
                  uVar28 = (ulong)(uint)((int)_c >> 2);
                  if ((int)_c >> 2 < 1) {
                    uVar28 = uVar27;
                  }
                  for (; sVar9 = top_blob_tm.elemsize, uVar27 != uVar28; uVar27 = uVar27 + 1) {
                    iVar23 = top_blob_tm.w;
                    lVar41 = top_blob_tm.cstep * top_blob_tm.elemsize;
                    top_blob_bordered.data = (void *)(lVar41 * uVar27 * 4 + (long)top_blob_tm.data);
                    top_blob_bordered.refcount._0_4_ = 0;
                    top_blob_bordered.refcount._4_4_ = 0;
                    top_blob_bordered.elemsize = top_blob_tm.elemsize;
                    top_blob_bordered.elempack = top_blob_tm.elempack;
                    top_blob_bordered.dims = 2;
                    top_blob_bordered.allocator = top_blob_tm.allocator;
                    top_blob_bordered.w = top_blob_tm.w;
                    lVar52 = uVar27 * 4 + 1;
                    d2._0_8_ = lVar41 * lVar52 + (long)top_blob_tm.data;
                    d2[2] = 0.0;
                    d2[3] = 0.0;
                    top_blob_bordered.c = 1;
                    top_blob_bordered.h = top_blob_tm.h;
                    local_408 = top_blob_tm.elemsize;
                    local_3ec = top_blob_tm.w;
                    lVar42 = uVar27 * 4 + 2;
                    d3[2] = 0.0;
                    d3[3] = 0.0;
                    d3._0_8_ = (void *)(lVar41 * lVar42 + (long)top_blob_tm.data);
                    lVar40 = uVar27 * 4 + 3;
                    w0._0_8_ = lVar41 * lVar40 + (long)top_blob_tm.data;
                    w0[2] = 0.0;
                    w0[3] = 0.0;
                    top_blob_bordered.cstep = (long)(top_blob_tm.h * top_blob_tm.w);
                    Mat::channel((Mat *)w1,this_00,(int)(uVar27 * 4));
                    Mat::channel((Mat *)w2,this_00,(int)lVar52);
                    Mat::channel((Mat *)w3,this_00,(int)lVar42);
                    Mat::channel((Mat *)t0,this_00,(int)lVar40);
                    for (iVar33 = 0; uVar22 = d2._0_8_, sVar16 = top_blob_bordered.elemsize,
                        pvVar35 = top_blob_bordered.data, uVar20 = w0._0_8_, iVar33 != (int)uVar31;
                        iVar33 = iVar33 + 1) {
                      iVar32 = top_blob_bordered.w;
                      uVar21 = d3._0_8_;
                      t1[0] = 0.0;
                      t1[1] = 0.0;
                      t1[2] = 0.0;
                      t1[3] = 0.0;
                      t2[0] = 0.0;
                      t2[1] = 0.0;
                      t2[2] = 0.0;
                      t2[3] = 0.0;
                      t3[0] = 0.0;
                      t3[1] = 0.0;
                      t3[2] = 0.0;
                      t3[3] = 0.0;
                      sum3[0xc] = 0.0;
                      sum3[0xd] = 0.0;
                      sum3[0xe] = 0.0;
                      sum3[0xf] = 0.0;
                      sum3[8] = 0.0;
                      sum3[9] = 0.0;
                      sum3[10] = 0.0;
                      sum3[0xb] = 0.0;
                      sum3[4] = 0.0;
                      sum3[5] = 0.0;
                      sum3[6] = 0.0;
                      sum3[7] = 0.0;
                      sum3[0] = 0.0;
                      sum3[1] = 0.0;
                      sum3[2] = 0.0;
                      sum3[3] = 0.0;
                      local_620 = 1;
                      local_498 = 2;
                      local_460 = 3;
                      for (uVar43 = 0; sVar12 = bottom_blob_tm.elemsize,
                          pvVar49 = bottom_blob_tm.data, (long)(uVar43 | 3) < lVar38;
                          uVar43 = uVar43 + 4) {
                        iVar55 = bottom_blob_tm.w;
                        lVar52 = bottom_blob_tm.cstep * uVar43;
                        d3_1 = (float  [2])
                               (lVar52 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data);
                        Mat::~Mat((Mat *)d3_1);
                        sVar13 = bottom_blob_tm.elemsize;
                        pvVar30 = bottom_blob_tm.data;
                        iVar24 = bottom_blob_tm.w;
                        sVar17 = bottom_blob_tm.cstep;
                        d3_1 = (float  [2])
                               ((uVar43 | 1) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
                               (long)bottom_blob_tm.data);
                        Mat::~Mat((Mat *)d3_1);
                        sVar14 = bottom_blob_tm.elemsize;
                        pvVar36 = bottom_blob_tm.data;
                        iVar51 = bottom_blob_tm.w;
                        sVar18 = bottom_blob_tm.cstep;
                        d3_1 = (float  [2])
                               ((uVar43 | 2) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
                               (long)bottom_blob_tm.data);
                        Mat::~Mat((Mat *)d3_1);
                        sVar15 = bottom_blob_tm.elemsize;
                        pvVar39 = bottom_blob_tm.data;
                        iVar7 = bottom_blob_tm.w;
                        sVar19 = bottom_blob_tm.cstep;
                        d3_1 = (float  [2])
                               ((uVar43 | 3) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
                               (long)bottom_blob_tm.data);
                        Mat::~Mat((Mat *)d3_1);
                        iVar34 = (int)uVar43;
                        lVar42 = (long)(local_25c * iVar34) * local_278 + CONCAT44(t0[1],t0[0]);
                        lVar40 = (long)(local_19c * iVar34) * local_1b8 + CONCAT44(w3[1],w3[0]);
                        lVar41 = (long)(local_15c * iVar34) * local_178 + CONCAT44(w2[1],w2[0]);
                        lVar45 = (long)(local_11c * iVar34) * local_138 + CONCAT44(w1[1],w1[0]);
                        for (lVar47 = 0; lVar47 != 0x40; lVar47 = lVar47 + 4) {
                          fVar53 = *(float *)((long)pvVar39 +
                                             lVar47 + ((long)(iVar7 * iVar33) + sVar19 * local_460)
                                                      * sVar15);
                          fVar58 = *(float *)((long)pvVar36 +
                                             lVar47 + ((long)(iVar51 * iVar33) + sVar18 * local_498)
                                                      * sVar14);
                          fVar1 = *(float *)((long)pvVar30 +
                                            lVar47 + ((long)(iVar24 * iVar33) + sVar17 * local_620)
                                                     * sVar13);
                          fVar2 = *(float *)((long)pvVar49 +
                                            lVar47 + (iVar55 * iVar33 + lVar52) * sVar12);
                          *(float *)((long)t1 + lVar47) =
                               *(float *)(lVar45 + 0xc0 + lVar47) * fVar53 +
                               *(float *)(lVar45 + 0x40 + lVar47) * fVar1 +
                               *(float *)(lVar45 + 0x80 + lVar47) * fVar58 +
                               *(float *)(lVar45 + lVar47) * fVar2 + *(float *)((long)t1 + lVar47);
                          *(float *)((long)t2 + lVar47) =
                               *(float *)(lVar41 + 0xc0 + lVar47) * fVar53 +
                               *(float *)(lVar41 + 0x40 + lVar47) * fVar1 +
                               *(float *)(lVar41 + 0x80 + lVar47) * fVar58 +
                               *(float *)(lVar41 + lVar47) * fVar2 + *(float *)((long)t2 + lVar47);
                          *(float *)((long)t3 + lVar47) =
                               *(float *)(lVar40 + 0xc0 + lVar47) * fVar53 +
                               *(float *)(lVar40 + 0x40 + lVar47) * fVar1 +
                               *(float *)(lVar40 + 0x80 + lVar47) * fVar58 +
                               *(float *)(lVar40 + lVar47) * fVar2 + *(float *)((long)t3 + lVar47);
                          *(float *)((long)sum3 + lVar47) =
                               *(float *)(lVar42 + 0xc0 + lVar47) * fVar53 +
                               *(float *)(lVar42 + 0x40 + lVar47) * fVar1 +
                               *(float *)(lVar42 + 0x80 + lVar47) * fVar58 +
                               *(float *)(lVar42 + lVar47) * fVar2 + *(float *)((long)sum3 + lVar47)
                          ;
                        }
                        local_460 = local_460 + 4;
                        local_498 = local_498 + 4;
                        local_620 = local_620 + 4;
                      }
                      for (; sVar12 = bottom_blob_tm.elemsize, pvVar49 = bottom_blob_tm.data,
                          (long)uVar43 < lVar38; uVar43 = uVar43 + 1) {
                        iVar55 = bottom_blob_tm.w;
                        lVar41 = bottom_blob_tm.cstep * uVar43;
                        d3_1 = (float  [2])
                               (lVar41 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data);
                        Mat::~Mat((Mat *)d3_1);
                        iVar24 = (int)uVar43;
                        lVar52 = CONCAT44(t0[1],t0[0]);
                        lVar42 = CONCAT44(w3[1],w3[0]);
                        for (lVar40 = 0; lVar40 != 0x40; lVar40 = lVar40 + 4) {
                          fVar53 = *(float *)((long)pvVar49 +
                                             lVar40 + (iVar55 * iVar33 + lVar41) * sVar12);
                          *(float *)((long)t1 + lVar40) =
                               *(float *)((long)(local_11c * iVar24) * local_138 +
                                          CONCAT44(w1[1],w1[0]) + lVar40) * fVar53 +
                               *(float *)((long)t1 + lVar40);
                          *(float *)((long)t2 + lVar40) =
                               *(float *)((long)(local_15c * iVar24) * local_178 +
                                          CONCAT44(w2[1],w2[0]) + lVar40) * fVar53 +
                               *(float *)((long)t2 + lVar40);
                          *(float *)((long)t3 + lVar40) =
                               *(float *)((long)(local_19c * iVar24) * local_1b8 + lVar42 + lVar40)
                               * fVar53 + *(float *)((long)t3 + lVar40);
                          *(float *)((long)sum3 + lVar40) =
                               fVar53 * *(float *)((long)(local_25c * iVar24) * local_278 + lVar52 +
                                                  lVar40) + *(float *)((long)sum3 + lVar40);
                        }
                      }
                      for (lVar52 = 0; lVar52 != 0x40; lVar52 = lVar52 + 4) {
                        *(undefined4 *)((long)pvVar35 + lVar52 + sVar16 * (long)(iVar32 * iVar33)) =
                             *(undefined4 *)((long)t1 + lVar52);
                        *(undefined4 *)(uVar22 + sVar9 * (long)(iVar23 * iVar33) + lVar52) =
                             *(undefined4 *)((long)t2 + lVar52);
                        *(undefined4 *)(uVar21 + sVar9 * (long)(iVar23 * iVar33) + lVar52) =
                             *(undefined4 *)((long)t3 + lVar52);
                        *(undefined4 *)(uVar20 + sVar9 * (long)(iVar23 * iVar33) + lVar52) =
                             *(undefined4 *)((long)sum3 + lVar52);
                      }
                    }
                    Mat::~Mat((Mat *)t0);
                    Mat::~Mat((Mat *)w3);
                    Mat::~Mat((Mat *)w2);
                    Mat::~Mat((Mat *)w1);
                    Mat::~Mat((Mat *)w0);
                    Mat::~Mat((Mat *)d3);
                    Mat::~Mat((Mat *)d2);
                    Mat::~Mat(&top_blob_bordered);
                  }
                  for (; (long)uVar26 < (long)uVar50; uVar26 = uVar26 + 1) {
                    top_blob_bordered.data =
                         (void *)(top_blob_tm.cstep * uVar26 * top_blob_tm.elemsize +
                                 (long)top_blob_tm.data);
                    top_blob_bordered.refcount._0_4_ = 0;
                    top_blob_bordered.refcount._4_4_ = 0;
                    top_blob_bordered.elemsize = top_blob_tm.elemsize;
                    top_blob_bordered.elempack = top_blob_tm.elempack;
                    top_blob_bordered.dims = 2;
                    top_blob_bordered.allocator = top_blob_tm.allocator;
                    top_blob_bordered.w = top_blob_tm.w;
                    top_blob_bordered.c = 1;
                    top_blob_bordered.h = top_blob_tm.h;
                    top_blob_bordered.cstep = (long)(top_blob_tm.h * top_blob_tm.w);
                    Mat::channel((Mat *)d2,this_00,(int)uVar26);
                    for (iVar23 = 0; sVar9 = top_blob_bordered.elemsize,
                        pvVar35 = top_blob_bordered.data, iVar23 != (int)uVar31; iVar23 = iVar23 + 1
                        ) {
                      iVar33 = top_blob_bordered.w;
                      d3[0] = 0.0;
                      d3[1] = 0.0;
                      d3[2] = 0.0;
                      d3[3] = 0.0;
                      local_588 = 1;
                      local_620 = 2;
                      local_498 = 3;
                      for (uVar27 = 0; sVar16 = bottom_blob_tm.elemsize,
                          pvVar49 = bottom_blob_tm.data, (long)(uVar27 | 3) < lVar38;
                          uVar27 = uVar27 + 4) {
                        iVar32 = bottom_blob_tm.w;
                        lVar52 = bottom_blob_tm.cstep * uVar27;
                        w0._0_8_ = lVar52 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data;
                        w0[2] = 0.0;
                        w0[3] = 0.0;
                        Mat::~Mat((Mat *)w0);
                        sVar12 = bottom_blob_tm.elemsize;
                        pvVar30 = bottom_blob_tm.data;
                        iVar55 = bottom_blob_tm.w;
                        sVar15 = bottom_blob_tm.cstep;
                        w0._0_8_ = (uVar27 | 1) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
                                   (long)bottom_blob_tm.data;
                        w0[2] = 0.0;
                        w0[3] = 0.0;
                        Mat::~Mat((Mat *)w0);
                        sVar13 = bottom_blob_tm.elemsize;
                        pvVar36 = bottom_blob_tm.data;
                        iVar24 = bottom_blob_tm.w;
                        sVar17 = bottom_blob_tm.cstep;
                        w0._0_8_ = (uVar27 | 2) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
                                   (long)bottom_blob_tm.data;
                        w0[2] = 0.0;
                        w0[3] = 0.0;
                        Mat::~Mat((Mat *)w0);
                        sVar14 = bottom_blob_tm.elemsize;
                        pvVar39 = bottom_blob_tm.data;
                        iVar51 = bottom_blob_tm.w;
                        sVar18 = bottom_blob_tm.cstep;
                        w0._0_8_ = (uVar27 | 3) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
                                   (long)bottom_blob_tm.data;
                        w0[2] = 0.0;
                        w0[3] = 0.0;
                        Mat::~Mat((Mat *)w0);
                        lVar42 = (long)(local_3ec * (int)local_498) * local_408 + d2._0_8_;
                        lVar40 = (long)((int)local_620 * local_3ec) * local_408 + d2._0_8_;
                        lVar41 = (long)((int)local_588 * local_3ec) * local_408 + d2._0_8_;
                        lVar45 = (long)((int)uVar27 * local_3ec) * local_408 + d2._0_8_;
                        for (lVar47 = 0; lVar47 != 0x40; lVar47 = lVar47 + 4) {
                          *(float *)((long)d3 + lVar47) =
                               *(float *)((long)pvVar39 +
                                         lVar47 + ((long)(iVar51 * iVar23) + sVar18 * local_498) *
                                                  sVar14) * *(float *)(lVar42 + lVar47) +
                               *(float *)((long)pvVar30 +
                                         lVar47 + ((long)(iVar55 * iVar23) + sVar15 * local_588) *
                                                  sVar12) * *(float *)(lVar41 + lVar47) +
                               *(float *)((long)pvVar36 +
                                         lVar47 + ((long)(iVar24 * iVar23) + sVar17 * local_620) *
                                                  sVar13) * *(float *)(lVar40 + lVar47) +
                               *(float *)((long)pvVar49 +
                                         lVar47 + (iVar32 * iVar23 + lVar52) * sVar16) *
                               *(float *)(lVar45 + lVar47) + *(float *)((long)d3 + lVar47);
                        }
                        local_498 = local_498 + 4;
                        local_620 = local_620 + 4;
                        local_588 = local_588 + 4;
                      }
                      for (; sVar16 = bottom_blob_tm.elemsize, pvVar49 = bottom_blob_tm.data,
                          (long)uVar27 < lVar38; uVar27 = uVar27 + 1) {
                        iVar32 = bottom_blob_tm.w;
                        lVar42 = bottom_blob_tm.cstep * uVar27;
                        w0._0_8_ = lVar42 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data;
                        w0[2] = 0.0;
                        w0[3] = 0.0;
                        Mat::~Mat((Mat *)w0);
                        for (lVar52 = 0; lVar52 != 0x10; lVar52 = lVar52 + 1) {
                          d3[lVar52] = *(float *)((long)(local_3ec * (int)uVar27) * local_408 +
                                                  d2._0_8_ + lVar52 * 4) *
                                       *(float *)((long)pvVar49 +
                                                 lVar52 * 4 + (iVar32 * iVar23 + lVar42) * sVar16) +
                                       d3[lVar52];
                        }
                      }
                      for (lVar52 = 0; lVar52 != 0x10; lVar52 = lVar52 + 1) {
                        *(float *)((long)pvVar35 + lVar52 * 4 + sVar9 * (long)(iVar33 * iVar23)) =
                             d3[lVar52];
                      }
                    }
                    Mat::~Mat((Mat *)d2);
                    Mat::~Mat(&top_blob_bordered);
                  }
                  top_blob_bordered.elemsize = 0;
                  top_blob_bordered.elempack = 0;
                  top_blob_bordered.data = (void *)0x0;
                  top_blob_bordered.refcount._0_4_ = 0;
                  top_blob_bordered.refcount._4_4_ = 0;
                  top_blob_bordered.allocator = (Allocator *)0x0;
                  top_blob_bordered.dims = 0;
                  top_blob_bordered.w = 0;
                  top_blob_bordered.h = 0;
                  top_blob_bordered.c = 0;
                  top_blob_bordered.cstep = 0;
                  Mat::operator=(&bottom_blob_tm,&top_blob_bordered);
                  Mat::~Mat(&top_blob_bordered);
                  top_blob_bordered.elemsize = 0;
                  top_blob_bordered.elempack = 0;
                  top_blob_bordered.data = (void *)0x0;
                  top_blob_bordered.refcount._0_4_ = 0;
                  top_blob_bordered.refcount._4_4_ = 0;
                  top_blob_bordered.allocator = (Allocator *)0x0;
                  top_blob_bordered.dims = 0;
                  top_blob_bordered.w = 0;
                  top_blob_bordered.h = 0;
                  top_blob_bordered.c = 0;
                  top_blob_bordered.cstep = 0;
                  uVar4 = top_blob->w;
                  uVar6 = top_blob->h;
                  auVar54._4_4_ = -(uint)(_w == uVar4);
                  auVar54._0_4_ = -(uint)(_w == uVar4);
                  auVar54._8_4_ = -(uint)(_h_00 == uVar6);
                  auVar54._12_4_ = -(uint)(_h_00 == uVar6);
                  iVar23 = movmskpd(extraout_EAX,auVar54);
                  if (iVar23 == 3) {
                    Mat::operator=(&top_blob_bordered,top_blob);
                  }
                  else {
                    Mat::create(&top_blob_bordered,_w,_h_00,_c,4,opt->workspace_allocator);
                  }
                  uVar31 = 0;
                  uVar50 = (ulong)_c;
                  if ((int)_c < 1) {
                    uVar50 = uVar31;
                  }
                  while( true ) {
                    if (uVar31 == uVar50) break;
                    d2._0_8_ = (void *)(top_blob_tm.cstep * uVar31 * top_blob_tm.elemsize +
                                       (long)top_blob_tm.data);
                    d2[2] = 0.0;
                    d2[3] = 0.0;
                    pvVar35 = (void *)(top_blob_bordered.cstep * uVar31 * top_blob_bordered.elemsize
                                      + (long)top_blob_bordered.data);
                    d3[2] = 0.0;
                    d3[3] = 0.0;
                    d3._0_8_ = pvVar35;
                    if (pvVar10 == (void *)0x0) {
                      fVar53 = 0.0;
                    }
                    else {
                      fVar53 = *(float *)((long)pvVar10 + uVar31 * 4);
                    }
                    lVar52 = top_blob_bordered.elemsize * (long)top_blob_bordered.w;
                    lVar42 = (long)top_blob_tm.data +
                             top_blob_tm.cstep * top_blob_tm.elemsize * uVar31 + 0x30;
                    lVar38 = (long)top_blob_tm.w * top_blob_tm.elemsize;
                    for (uVar26 = 0; uVar26 != uVar48; uVar26 = uVar26 + 1) {
                      pafVar44 = (float (*) [2])(uVar26 * 2 * lVar52 + (long)pvVar35);
                      pfVar46 = (float *)((uVar26 * 2 + 1) * lVar52 + (long)pvVar35);
                      lVar40 = lVar42;
                      for (uVar27 = 0; uVar27 != uVar25; uVar27 = uVar27 + 1) {
                        for (lVar41 = 0; lVar41 != 0x10; lVar41 = lVar41 + 4) {
                          *(undefined4 *)((long)w0 + lVar41) =
                               *(undefined4 *)(lVar40 + -0x30 + lVar41);
                          *(undefined4 *)((long)w1 + lVar41) =
                               *(undefined4 *)(lVar40 + -0x20 + lVar41);
                          *(undefined4 *)((long)w2 + lVar41) =
                               *(undefined4 *)(lVar40 + -0x10 + lVar41);
                          *(undefined4 *)((long)w3 + lVar41) = *(undefined4 *)(lVar40 + lVar41);
                        }
                        for (lVar41 = 0; lVar41 != 0x10; lVar41 = lVar41 + 4) {
                          *(float *)((long)t0 + lVar41) =
                               *(float *)((long)w0 + lVar41) + *(float *)((long)w1 + lVar41) +
                               *(float *)((long)w2 + lVar41);
                          *(float *)((long)t1 + lVar41) =
                               (*(float *)((long)w1 + lVar41) - *(float *)((long)w2 + lVar41)) +
                               *(float *)((long)w3 + lVar41);
                        }
                        t2[1] = t1[0];
                        t2[0] = t0[0];
                        t3[1] = t1[1];
                        t3[0] = t0[1];
                        sum3[1] = t1[2];
                        sum3[0] = t0[2];
                        d3_1[1] = t1[3];
                        d3_1[0] = t0[3];
                        for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 4) {
                          fVar58 = *(float *)((long)t3 + lVar41) + fVar53;
                          *(float *)((long)o0 + lVar41) =
                               *(float *)((long)t2 + lVar41) + fVar58 +
                               *(float *)((long)sum3 + lVar41);
                          *(float *)((long)local_b8 + lVar41) =
                               (fVar58 - *(float *)((long)sum3 + lVar41)) +
                               *(float *)((long)d3_1 + lVar41);
                        }
                        *pafVar44 = o0;
                        *pfVar46 = local_b8[0];
                        pfVar46[1] = local_b8[1];
                        pafVar44 = pafVar44 + 1;
                        pfVar46 = pfVar46 + 2;
                        lVar40 = lVar40 + lVar38;
                      }
                      lVar42 = lVar42 + lVar38 * (int)uVar56;
                    }
                    Mat::~Mat((Mat *)d3);
                    Mat::~Mat((Mat *)d2);
                    uVar31 = uVar31 + 1;
                  }
                  copy_cut_border(&top_blob_bordered,top_blob,0,top_blob_bordered.h - top_blob->h,0,
                                  top_blob_bordered.w - top_blob->w,opt);
                  Mat::~Mat(&top_blob_bordered);
                  Mat::~Mat(&top_blob_tm);
                  Mat::~Mat(&bottom_blob_tm);
                  Mat::~Mat(&bottom_blob_bordered_1);
                }
              }
              else {
                conv_im2col_sgemm_sse
                          (&bottom_blob_bordered,top_blob,&this->weight_sgemm_data,
                           &pCVar37->bias_data,iVar55,iVar24,pCVar37->stride_w,pCVar37->stride_h,opt
                          );
              }
              pLVar11 = this->activation;
              if (pLVar11 != (Layer *)0x0) {
                (*pLVar11->_vptr_Layer[9])(pLVar11,top_blob,opt);
              }
              iVar24 = 0;
            }
          }
        }
      }
      Mat::~Mat(&bottom_blob_bordered);
      return iVar24;
    }
  }
  else {
    pCVar37 = (Convolution *)
              ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  }
  iVar23 = Convolution::forward(pCVar37,bottom_blob,top_blob,opt);
  return iVar23;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && (stride_w > 1 || stride_h > 1))
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw < dilation_w || outh < dilation_h)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
    }

    if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (use_winograd3x3 && outw >= 8 && outh >=8)
        {
            conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//             conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
        }
        else
        {
            conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }
    else
    {
//         conv1x1s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv1x1s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv5x5s1_neon(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}